

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvactxinfo.c
# Opt level: O1

uint32_t ctxsize_strands(uint32_t reg_base)

{
  int iVar1;
  undefined4 uVar2;
  uint uVar3;
  nva_card **ppnVar4;
  uint32_t uVar5;
  ulong uVar6;
  int iVar7;
  
  ppnVar4 = nva_cards;
  iVar1 = *(int *)((long)nva_cards[cnum]->bar0 + (ulong)(reg_base + 0x2880));
  uVar3 = reg_base + 0x20ac;
  if (dev < 0x101) {
    uVar3 = reg_base + 0x2ffc;
  }
  uVar6 = (ulong)uVar3;
  uVar2 = *(undefined4 *)((long)nva_cards[cnum]->bar0 + uVar6);
  if (iVar1 == 0) {
    uVar5 = 0;
  }
  else {
    uVar5 = 0;
    iVar7 = 0;
    do {
      *(int *)((long)ppnVar4[cnum]->bar0 + uVar6) = iVar7;
      uVar5 = uVar5 + *(int *)((long)ppnVar4[cnum]->bar0 + (ulong)(reg_base + 0x2910)) * 4;
      iVar7 = iVar7 + 1;
    } while (iVar1 != iVar7);
  }
  *(undefined4 *)((long)ppnVar4[cnum]->bar0 + uVar6) = uVar2;
  return uVar5;
}

Assistant:

uint32_t ctxsize_strands(uint32_t reg_base)
{
	uint32_t strand_count, strand_size = 0, io_idx, i;
	uint32_t host_io_port_off = dev > 0x100 ? 0x20ac : 0x2ffc;

	strand_count = nva_rd32(cnum, reg_base + 0x2880);
	io_idx = nva_rd32(cnum, reg_base + host_io_port_off);

	for (i = 0; i < strand_count; i++) {
		nva_wr32(cnum, reg_base + host_io_port_off, i);
		strand_size += (nva_rd32(cnum, reg_base + 0x2910) << 2);
	}
	nva_wr32(cnum, reg_base + host_io_port_off, io_idx);

	return strand_size;
}